

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest_StopAfterSyntaxIdentifierWithErrors_Test::
~ParserTest_StopAfterSyntaxIdentifierWithErrors_Test
          (ParserTest_StopAfterSyntaxIdentifierWithErrors_Test *this)

{
  ParserTest_StopAfterSyntaxIdentifierWithErrors_Test *this_local;
  
  ~ParserTest_StopAfterSyntaxIdentifierWithErrors_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserTest, StopAfterSyntaxIdentifierWithErrors) {
  SetupParser(
      "// blah\n"
      "syntax = error;\n");
  parser_->SetStopAfterSyntaxIdentifier(true);
  EXPECT_FALSE(parser_->Parse(input_.get(), nullptr));
  EXPECT_EQ("1:9: Expected syntax identifier.\n", error_collector_.text_);
}